

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffmkys(fitsfile *fptr,char *keyname,char *value,char *comm,int *status)

{
  long lVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  int local_1dc;
  int keypos;
  int len;
  char nextcomm [73];
  char card [81];
  char local_128 [8];
  char oldcomm [73];
  char valstring [71];
  char local_88 [8];
  char oldval [71];
  int *status_local;
  char *comm_local;
  char *value_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    iVar3 = ffgkey(fptr,keyname,local_88,local_128,status);
    if (iVar3 < 1) {
      ffs2c(value,oldcomm + 0x48,status);
      if ((comm == (char *)0x0) || (*comm == '&')) {
        ffmkky(keyname,oldcomm + 0x48,local_128,nextcomm + 0x48,status);
      }
      else {
        ffmkky(keyname,oldcomm + 0x48,comm,nextcomm + 0x48,status);
      }
      ffmkey(fptr,nextcomm + 0x48,status);
      lVar1 = fptr->Fptr->nextkey;
      lVar2 = fptr->Fptr->headstart[fptr->Fptr->curhdu];
      if (*status < 1) {
        ffpmrk();
        ffc2s(local_88,oldcomm + 0x48,status);
        if (*status == 0xcc) {
          ffcmrk();
          *status = 0;
        }
        else {
          sVar4 = strlen(oldcomm + 0x48);
          local_1dc = (int)sVar4;
          while( true ) {
            bVar5 = false;
            if (local_1dc != 0) {
              bVar5 = oldcomm[(long)(local_1dc + -1) + 0x48] == '&';
            }
            if (!bVar5) break;
            keypos._0_1_ = 0;
            ffgcnt(fptr,oldcomm + 0x48,(char *)&keypos,status);
            if ((oldcomm[0x48] == '\0') && (sVar4 = strlen((char *)&keypos), sVar4 == 0)) {
              local_1dc = 0;
            }
            else {
              ffdrec(fptr,(int)((lVar1 - lVar2) / 0x50) + 1,status);
              sVar4 = strlen(oldcomm + 0x48);
              local_1dc = (int)sVar4;
            }
          }
        }
        fptr_local._4_4_ = *status;
      }
      else {
        fptr_local._4_4_ = *status;
      }
    }
    else {
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffmkys(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           const char *value,       /* I - keyword value      */
           const char *comm,        /* I - keyword comment    */
           int *status)             /* IO - error status      */
{
  /* NOTE: This routine does not support long continued strings */
  /*  It will correctly overwrite an existing long continued string, */
  /*  but it will not write a new long string.  */

    char oldval[FLEN_VALUE], valstring[FLEN_VALUE];
    char oldcomm[FLEN_COMMENT];
    char card[FLEN_CARD], nextcomm[FLEN_COMMENT];
    int len, keypos;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, oldval, oldcomm, status) > 0)
        return(*status);                               /* get old comment */

    ffs2c(value, valstring, status);   /* convert value to a string */

    if (!comm || comm[0] == '&')  /* preserve the current comment string */
        ffmkky(keyname, valstring, oldcomm, card, status);
    else
        ffmkky(keyname, valstring, comm, card, status);

    ffmkey(fptr, card, status); /* overwrite the previous keyword */

    keypos = (int) (((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80) + 1);

    if (*status > 0)           
        return(*status);

    /* check if old string value was continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(oldval, valstring, status); /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
        
      len = strlen(valstring);

      while (len && valstring[len - 1] == '&')  /* ampersand is continuation char */
      {
        nextcomm[0]='\0';
        ffgcnt(fptr, valstring, nextcomm, status);
        if (*valstring || strlen(nextcomm))
        {
            ffdrec(fptr, keypos, status);  /* delete the continuation */
            len = strlen(valstring);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}